

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O2

void Msat_SolverResize(Msat_Solver_t *p,int nVarsAlloc)

{
  int iVar1;
  double *pdVar2;
  float *pfVar3;
  int *piVar4;
  Msat_ClauseVec_t **ppMVar5;
  Msat_ClauseVec_t *pMVar6;
  Msat_Queue_t *pMVar7;
  Msat_Clause_t **ppMVar8;
  Msat_IntVec_t *Entry;
  long lVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  
  iVar1 = p->nVarsAlloc;
  lVar12 = (long)iVar1;
  p->nVarsAlloc = nVarsAlloc;
  if (p->pdActivity == (double *)0x0) {
    pdVar2 = (double *)malloc((long)nVarsAlloc << 3);
  }
  else {
    pdVar2 = (double *)realloc(p->pdActivity,(long)nVarsAlloc << 3);
  }
  p->pdActivity = pdVar2;
  lVar11 = (long)p->nVarsAlloc;
  if (p->pFactors == (float *)0x0) {
    pfVar3 = (float *)malloc(lVar11 * 4);
  }
  else {
    pfVar3 = (float *)realloc(p->pFactors,lVar11 * 4);
    lVar11 = (long)p->nVarsAlloc;
  }
  p->pFactors = pfVar3;
  for (lVar9 = lVar12; lVar9 < lVar11; lVar9 = lVar9 + 1) {
    p->pdActivity[lVar9] = 0.0;
    pfVar3[lVar9] = 1.0;
  }
  if (p->pAssigns == (int *)0x0) {
    piVar4 = (int *)malloc(lVar11 << 2);
  }
  else {
    piVar4 = (int *)realloc(p->pAssigns,lVar11 << 2);
  }
  p->pAssigns = piVar4;
  sVar10 = (long)p->nVarsAlloc << 2;
  if (p->pModel == (int *)0x0) {
    piVar4 = (int *)malloc(sVar10);
  }
  else {
    piVar4 = (int *)realloc(p->pModel,sVar10);
  }
  p->pModel = piVar4;
  for (lVar11 = lVar12; lVar11 < p->nVarsAlloc; lVar11 = lVar11 + 1) {
    p->pAssigns[lVar11] = -1;
  }
  Msat_OrderSetBounds(p->pOrder,p->nVarsAlloc);
  sVar10 = (long)p->nVarsAlloc << 4;
  if (p->pvWatched == (Msat_ClauseVec_t **)0x0) {
    ppMVar5 = (Msat_ClauseVec_t **)malloc(sVar10);
  }
  else {
    ppMVar5 = (Msat_ClauseVec_t **)realloc(p->pvWatched,sVar10);
  }
  p->pvWatched = ppMVar5;
  for (lVar11 = (long)(iVar1 * 2);
      SBORROW8(lVar11,(long)p->nVarsAlloc * 2) != lVar11 + (long)p->nVarsAlloc * -2 < 0;
      lVar11 = lVar11 + 1) {
    pMVar6 = Msat_ClauseVecAlloc(0x10);
    p->pvWatched[lVar11] = pMVar6;
  }
  Msat_QueueFree(p->pQueue);
  pMVar7 = Msat_QueueAlloc(p->nVarsAlloc);
  p->pQueue = pMVar7;
  sVar10 = (long)p->nVarsAlloc << 3;
  if (p->pReasons == (Msat_Clause_t **)0x0) {
    ppMVar8 = (Msat_Clause_t **)malloc(sVar10);
  }
  else {
    ppMVar8 = (Msat_Clause_t **)realloc(p->pReasons,sVar10);
  }
  p->pReasons = ppMVar8;
  sVar10 = (long)p->nVarsAlloc << 2;
  if (p->pLevel == (int *)0x0) {
    piVar4 = (int *)malloc(sVar10);
  }
  else {
    piVar4 = (int *)realloc(p->pLevel,sVar10);
  }
  p->pLevel = piVar4;
  lVar11 = lVar12;
  while( true ) {
    iVar1 = p->nVarsAlloc;
    lVar9 = (long)iVar1;
    if (lVar9 <= lVar11) break;
    p->pReasons[lVar11] = (Msat_Clause_t *)0x0;
    p->pLevel[lVar11] = -1;
    lVar11 = lVar11 + 1;
  }
  if (p->pSeen == (int *)0x0) {
    piVar4 = (int *)malloc(lVar9 * 4);
  }
  else {
    piVar4 = (int *)realloc(p->pSeen,lVar9 * 4);
    iVar1 = p->nVarsAlloc;
    lVar9 = (long)iVar1;
  }
  p->pSeen = piVar4;
  for (; lVar12 < lVar9; lVar12 = lVar12 + 1) {
    piVar4[lVar12] = 0;
  }
  Msat_IntVecGrow(p->vTrail,iVar1);
  Msat_IntVecGrow(p->vTrailLim,p->nVarsAlloc);
  for (iVar1 = Msat_ClauseVecReadSize(p->vAdjacents); iVar1 < p->nVarsAlloc; iVar1 = iVar1 + 1) {
    pMVar6 = p->vAdjacents;
    Entry = Msat_IntVecAlloc(5);
    Msat_ClauseVecPush(pMVar6,(Msat_Clause_t *)Entry);
  }
  Msat_IntVecFill(p->vVarsUsed,p->nVarsAlloc,1);
  return;
}

Assistant:

void Msat_SolverResize( Msat_Solver_t * p, int nVarsAlloc )
{
    int nVarsAllocOld, i;

    nVarsAllocOld = p->nVarsAlloc;
    p->nVarsAlloc = nVarsAlloc;

    p->pdActivity = ABC_REALLOC( double, p->pdActivity, p->nVarsAlloc );
    p->pFactors   = ABC_REALLOC( float, p->pFactors, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
    {
        p->pdActivity[i] = 0.0;
        p->pFactors[i]   = 1.0;
    }

    p->pAssigns  = ABC_REALLOC( int, p->pAssigns, p->nVarsAlloc );
    p->pModel    = ABC_REALLOC( int, p->pModel, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
        p->pAssigns[i] = MSAT_VAR_UNASSIGNED;

//    Msat_OrderRealloc( p->pOrder, p->pAssigns, p->pdActivity, p->nVarsAlloc );
    Msat_OrderSetBounds( p->pOrder, p->nVarsAlloc );

    p->pvWatched = ABC_REALLOC( Msat_ClauseVec_t *, p->pvWatched, 2 * p->nVarsAlloc );
    for ( i = 2 * nVarsAllocOld; i < 2 * p->nVarsAlloc; i++ )
        p->pvWatched[i] = Msat_ClauseVecAlloc( 16 );

    Msat_QueueFree( p->pQueue );
    p->pQueue    = Msat_QueueAlloc( p->nVarsAlloc );

    p->pReasons  = ABC_REALLOC( Msat_Clause_t *, p->pReasons, p->nVarsAlloc );
    p->pLevel    = ABC_REALLOC( int, p->pLevel, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
    {
        p->pReasons[i] = NULL;
        p->pLevel[i] = -1;
    }

    p->pSeen     = ABC_REALLOC( int, p->pSeen, p->nVarsAlloc );
    for ( i = nVarsAllocOld; i < p->nVarsAlloc; i++ )
        p->pSeen[i] = 0;

    Msat_IntVecGrow( p->vTrail, p->nVarsAlloc );
    Msat_IntVecGrow( p->vTrailLim, p->nVarsAlloc );

    // make sure the array of adjucents has room to store the variable numbers
    for ( i = Msat_ClauseVecReadSize(p->vAdjacents); i < p->nVarsAlloc; i++ )
        Msat_ClauseVecPush( p->vAdjacents, (Msat_Clause_t *)Msat_IntVecAlloc(5) );
    Msat_IntVecFill( p->vVarsUsed, p->nVarsAlloc, 1 );
}